

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf_write.h
# Opt level: O3

void cgltf_write_floatprop(cgltf_write_context *context,char *label,float val,float def)

{
  int iVar1;
  cgltf_size cVar2;
  char *pcVar3;
  size_t __maxlen;
  
  if ((val != def) || (NAN(val) || NAN(def))) {
    cgltf_write_indent(context);
    pcVar3 = (char *)0x0;
    iVar1 = snprintf(context->cursor,context->remaining,"\"%s\": ",label);
    cVar2 = (cgltf_size)iVar1;
    context->tmp = cVar2;
    context->chars_written = context->chars_written + cVar2;
    __maxlen = context->remaining;
    if (context->cursor != (char *)0x0) {
      pcVar3 = context->cursor + cVar2;
      context->cursor = pcVar3;
      __maxlen = __maxlen - cVar2;
      context->remaining = __maxlen;
    }
    iVar1 = snprintf(pcVar3,__maxlen,"%.*g",(double)val,9);
    cVar2 = (cgltf_size)iVar1;
    context->tmp = cVar2;
    context->chars_written = context->chars_written + cVar2;
    pcVar3 = context->cursor;
    if (pcVar3 == (char *)0x0) {
      context->needs_comma = 1;
    }
    else {
      context->cursor = pcVar3 + cVar2;
      context->remaining = context->remaining - cVar2;
      context->needs_comma = 1;
      pcVar3 = strchr(pcVar3,0x2c);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '.';
      }
    }
  }
  return;
}

Assistant:

static void cgltf_write_floatprop(cgltf_write_context* context, const char* label, float val, float def)
{
	if (val != def)
	{
		cgltf_write_indent(context);
		CGLTF_SPRINTF("\"%s\": ", label);
		CGLTF_SPRINTF("%.*g", CGLTF_DECIMAL_DIG, val);
		context->needs_comma = 1;

		if (context->cursor)
		{
			char *decimal_comma = strchr(context->cursor - context->tmp, ',');
			if (decimal_comma)
			{
				*decimal_comma = '.';
			}
		}
	}
}